

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O0

void remove_driver(char *pci_addr)

{
  char *__buf;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  char *in_RDI;
  char buf [512];
  int err;
  int64_t result;
  int fd;
  char path [4096];
  undefined1 local_1228 [524];
  int local_101c;
  long local_1018;
  int local_100c;
  char local_1008 [4096];
  char *local_8;
  
  local_8 = in_RDI;
  snprintf(local_1008,0x1000,"/sys/bus/pci/devices/%s/driver/unbind",in_RDI);
  iVar1 = open(local_1008,1);
  __buf = local_8;
  local_100c = iVar1;
  if (iVar1 == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): no driver loaded\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x11,
            "remove_driver");
  }
  else {
    sVar2 = strlen(local_8);
    sVar2 = write(iVar1,__buf,sVar2);
    sVar3 = strlen(local_8);
    if (sVar2 != sVar3) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): failed to unload driver for device %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x15,
              "remove_driver",local_8);
    }
    iVar1 = close(local_100c);
    local_1018 = (long)iVar1;
    if (local_1018 == -1) {
      piVar4 = __errno_location();
      local_101c = *piVar4;
      __xpg_strerror_r(local_101c,local_1228,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x17,
              "remove_driver","close",local_1228);
      exit(local_101c);
    }
  }
  return;
}

Assistant:

void remove_driver(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/driver/unbind", pci_addr);
	int fd = open(path, O_WRONLY);
	if (fd == -1) {
		debug("no driver loaded");
		return;
	}
	if (write(fd, pci_addr, strlen(pci_addr)) != (ssize_t) strlen(pci_addr)) {
		warn("failed to unload driver for device %s", pci_addr);
	}
	check_err(close(fd), "close");
}